

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

Var * __thiscall jsonnet::internal::Desugarer::std(Desugarer *this)

{
  char32_t *pcVar1;
  Var *pVVar2;
  char32_t *pcVar3;
  UString local_40;
  Identifier *local_20;
  
  pcVar3 = L"$std";
  if (this->isStdlib != false) {
    pcVar3 = L"std";
  }
  pcVar3 = pcVar3 + -1;
  do {
    pcVar1 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
  } while (*pcVar1 != L'\0');
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_40);
  local_20 = Allocator::makeIdentifier(this->alloc,&local_40);
  pVVar2 = Allocator::
           make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                     (this->alloc,(LocationRange *)E,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  return pVVar2;
}

Assistant:

Var *std(void)
    {
        // In most places, there is a "$std" variable inserted by
        // the desugarer. On the standard library itself there isn't,
        // so use "std" instead.
        return var(id(isStdlib ? U"std" : U"$std"));
    }